

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::GetElementIWithCache<true>
              (Var instance,RecyclableObject *index,
              PropertyRecordUsageCache *propertyRecordUsageCache,ScriptContext *scriptContext,
              PropertyCacheOperationInfo *operationInfo)

{
  PropertyRecord *pPVar1;
  bool bVar2;
  uint32 index_00;
  PropertyId propertyKey;
  BOOL BVar3;
  JavascriptLibrary *pJVar4;
  RecyclableObject *pRVar5;
  PropertyRecord *this;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  Var value;
  PropertyRecord *propertyRecord;
  RecyclableObject *object;
  PropertyCacheOperationInfo *operationInfo_local;
  ScriptContext *scriptContext_local;
  PropertyRecordUsageCache *propertyRecordUsageCache_local;
  RecyclableObject *index_local;
  Var instance_local;
  
  propertyRecord = (PropertyRecord *)0x0;
  object = (RecyclableObject *)operationInfo;
  operationInfo_local = (PropertyCacheOperationInfo *)scriptContext;
  scriptContext_local = (ScriptContext *)propertyRecordUsageCache;
  propertyRecordUsageCache_local = (PropertyRecordUsageCache *)index;
  index_local = (RecyclableObject *)instance;
  bVar2 = GetPropertyObjectForGetElementI
                    (instance,index,scriptContext,(RecyclableObject **)&propertyRecord);
  if (!bVar2) {
    pJVar4 = ScriptContext::GetLibrary((ScriptContext *)operationInfo_local);
    pRVar5 = JavascriptLibraryBase::GetUndefined(&pJVar4->super_JavascriptLibraryBase);
    return pRVar5;
  }
  this = PropertyRecordUsageCache::GetPropertyRecord
                   ((PropertyRecordUsageCache *)scriptContext_local);
  bVar2 = PropertyRecord::IsNumeric(this);
  pRVar5 = index_local;
  pPVar1 = propertyRecord;
  if (bVar2) {
    index_00 = PropertyRecord::GetNumericValue(this);
    BVar3 = GetItem(pRVar5,(RecyclableObject *)pPVar1,index_00,(Var *)&info.inlineCacheIndex,
                    (ScriptContext *)operationInfo_local);
    if (BVar3 != 0) {
      return (Var)info._56_8_;
    }
  }
  else {
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_90);
    bVar2 = PropertyRecordUsageCache::TryGetPropertyFromCache<false,false,true>
                      ((PropertyRecordUsageCache *)scriptContext_local,index_local,
                       (RecyclableObject *)propertyRecord,(Var *)&info.inlineCacheIndex,
                       (ScriptContext *)operationInfo_local,(PropertyValueInfo *)local_90,
                       (RecyclableObject *)propertyRecordUsageCache_local,
                       (PropertyCacheOperationInfo *)object);
    pRVar5 = index_local;
    pPVar1 = propertyRecord;
    if (bVar2) {
      return (Var)info._56_8_;
    }
    propertyKey = PropertyRecord::GetPropertyId(this);
    BVar3 = GetPropertyWPCache<false,int>
                      (pRVar5,(RecyclableObject *)pPVar1,propertyKey,(Var *)&info.inlineCacheIndex,
                       (ScriptContext *)operationInfo_local,(PropertyValueInfo *)local_90);
    if (BVar3 != 0) {
      return (Var)info._56_8_;
    }
  }
  pJVar4 = ScriptContext::GetLibrary((ScriptContext *)operationInfo_local);
  pRVar5 = JavascriptLibraryBase::GetUndefined(&pJVar4->super_JavascriptLibraryBase);
  return pRVar5;
}

Assistant:

Var JavascriptOperators::GetElementIWithCache(
        _In_ Var instance,
        _In_ RecyclableObject* index,
        _In_ PropertyRecordUsageCache* propertyRecordUsageCache,
        _In_ ScriptContext* scriptContext,
        _Inout_opt_ PropertyCacheOperationInfo* operationInfo)
    {
        RecyclableObject* object = nullptr;
        if (!JavascriptOperators::GetPropertyObjectForGetElementI(instance, index, scriptContext, &object))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        PropertyRecord const * propertyRecord = propertyRecordUsageCache->GetPropertyRecord();
        Var value;

        if (propertyRecord->IsNumeric())
        {
            if (JavascriptOperators::GetItem(instance, object, propertyRecord->GetNumericValue(), &value, scriptContext))
            {
                return value;
            }
        }
        else
        {
            PropertyValueInfo info;
            if (propertyRecordUsageCache->TryGetPropertyFromCache<false /* OwnPropertyOnly */, false /* OutputExistence */, ReturnOperationInfo>(instance, object, &value, scriptContext, &info, index, operationInfo))
            {
                return value;
            }
            if (JavascriptOperators::GetPropertyWPCache<false /* OutputExistence */>(instance, object, propertyRecord->GetPropertyId(), &value, scriptContext, &info))
            {
                return value;
            }
        }
        return scriptContext->GetLibrary()->GetUndefined();
    }